

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_writer.h
# Opt level: O3

OutputWriter * __thiscall
uttamarin::OutputWriter::WriteColorized<char_const*>(OutputWriter *this,char *input,TextColor color)

{
  pointer ppbVar1;
  ostream *poVar2;
  size_t sVar3;
  pointer ppbVar4;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *__range2;
  
  ppbVar1 = (this->streams_).
            super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppbVar4 = (this->streams_).
                 super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppbVar4 != ppbVar1;
      ppbVar4 = ppbVar4 + 1) {
    poVar2 = *ppbVar4;
    if (poVar2 == (ostream *)&std::cout) {
      WriteColorized<char_const*>(this,(ostream *)&std::cout,input,color);
    }
    else if (input == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(*(long *)poVar2 + -0x18) + (int)poVar2);
    }
    else {
      sVar3 = strlen(input);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,input,sVar3);
    }
  }
  return this;
}

Assistant:

OutputWriter& OutputWriter::WriteColorized(T input, TextColor color) {
  for(auto stream : streams_){
    if(stream == &std::cout) WriteColorized(*stream, input, color);
    else *stream << input;
  }
  return *this;
}